

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O1

void ymf278b_pcm_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  char *pcVar1;
  YMF278BSlot *slot;
  size_t __n;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  INT16 IVar7;
  INT16 IVar8;
  ushort uVar9;
  UINT16 pos;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  short sVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  char cVar18;
  uint uVar19;
  short *psVar20;
  int iVar21;
  bool bVar22;
  ulong local_60;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  lVar15 = 0x4f;
  do {
    pcVar1 = (char *)((long)info + lVar15);
    if (*pcVar1 != '\0') break;
    bVar22 = lVar15 != 0x4fb;
    lVar15 = lVar15 + 0x34;
  } while (bVar22);
  if ((*pcVar1 != '\0') && (samples != 0)) {
    iVar4 = mix_level[*(int *)((long)info + 0x518)];
    iVar5 = mix_level[*(int *)((long)info + 0x51c)];
    local_60 = 0;
    do {
      lVar15 = 0;
      do {
        if ((*(char *)((long)info + lVar15 + 0x4f) != '\0') &&
           (*(char *)((long)info + lVar15 + 0x51) == '\0')) {
          slot = (YMF278BSlot *)((long)info + lVar15 + 0x20);
          iVar6 = *(int *)((long)info + lVar15 + 0x30);
          IVar7 = ymf278b_getSample((YMF278BChip *)info,slot,(UINT16)iVar6);
          pos = (UINT16)(iVar6 + 1U);
          uVar14 = (uint)*(ushort *)((long)info + lVar15 + 0x26);
          uVar10 = (iVar6 + 1U & 0xffff) + uVar14;
          if (0xffff < uVar10) {
            pos = (short)uVar10 + *(short *)((long)info + lVar15 + 0x24);
          }
          iVar16 = *(int *)((long)info + lVar15 + 0x2c);
          IVar8 = ymf278b_getSample((YMF278BChip *)info,slot,pos);
          uVar9 = *(ushort *)((long)info + lVar15 + 0x32);
          uVar10 = (uint)uVar9;
          cVar18 = *(char *)((long)info + lVar15 + 0x50);
          if ((cVar18 != '\0') &&
             (uVar12 = (ulong)*(byte *)((long)info + lVar15 + 0x48), uVar12 != 0)) {
            uVar10 = *(uint *)((long)info + lVar15 + 0x34);
            uVar19 = uVar10 >> 10;
            uVar11 = uVar19 & 0xff7f ^ 0x7f;
            if ((uVar10 >> 0x11 & 1) == 0) {
              uVar11 = uVar19;
            }
            uVar10 = (uint)uVar9 + ((uint)""[uVar12] * (uVar11 & 0xffff) >> 7);
          }
          if (0x27f < (uVar10 & 0xffff)) {
            uVar10 = 0x280;
          }
          bVar2 = *(byte *)((long)info + lVar15 + 0x43);
          iVar21 = pan_right[bVar2];
          iVar16 = (((IVar8 * iVar16 + (0x10000 - iVar16) * (int)IVar7 >> 0x10) *
                     vol_tab[(ulong)uVar10 & 0xffff] >> 0xf) *
                    vol_tab[(ulong)*(byte *)((long)info + lVar15 + 0x42) * 4] >> 0xf) * 0x5a82 >>
                   0x11;
          (*outputs)[local_60] =
               (*outputs)[local_60] +
               ((int)((0x20 - (pan_left[bVar2] + iVar4 & 0xfU) >>
                      ((byte)((uint)(pan_left[bVar2] + iVar4) >> 4) & 0x1f)) * iVar16) >> 5);
          outputs[1][local_60] =
               outputs[1][local_60] +
               ((int)(iVar16 * (0x20 - (iVar21 + iVar5 & 0xfU) >>
                               ((byte)((uint)(iVar21 + iVar5) >> 4) & 0x1f))) >> 5);
          if ((cVar18 == '\0') ||
             (uVar12 = (ulong)*(byte *)((long)info + lVar15 + 0x47), uVar12 == 0)) {
            uVar10 = *(uint *)((long)info + lVar15 + 0x28);
          }
          else {
            cVar18 = *(char *)((long)info + lVar15 + 0x3e);
            uVar10 = 0;
            if (cVar18 != -8) {
              uVar10 = *(uint *)((long)info + lVar15 + 0x34);
              uVar19 = uVar10 >> 0xc;
              uVar11 = uVar19 & 0xffffffef ^ 0xf;
              if ((uVar10 >> 0x10 & 1) == 0) {
                uVar11 = uVar19;
              }
              uVar9 = -((ushort)uVar11 & 0xf);
              if ((uVar11 & 0x20) == 0) {
                uVar9 = (ushort)uVar11;
              }
              iVar16 = (int)vib_depth[uVar12] * (int)(short)uVar9;
              uVar10 = ((int)(short)((short)((uint)(iVar16 / 6 + (iVar16 >> 0x1f)) >> 1) -
                                    (short)(iVar16 >> 0x1f)) +
                        (uint)*(ushort *)((long)info + lVar15 + 0x3c) + 0x400 <<
                       (cVar18 + 8U & 0x1f)) >> 3;
            }
          }
          uVar10 = uVar10 + *(int *)((long)info + lVar15 + 0x2c);
          *(uint *)((long)info + lVar15 + 0x2c) = uVar10;
          if (0xffff < uVar10) {
            uVar11 = (uVar10 >> 0x10) + iVar6;
            sVar13 = (short)uVar11;
            uVar14 = (uVar11 & 0xffff) + uVar14;
            if (0xffff < uVar14) {
              sVar13 = (short)uVar14 + *(short *)((long)info + lVar15 + 0x24);
            }
            *(short *)((long)info + lVar15 + 0x30) = sVar13;
            *(uint *)((long)info + lVar15 + 0x2c) = uVar10 & 0xffff;
          }
        }
        lVar15 = lVar15 + 0x34;
      } while (lVar15 != 0x4e0);
      iVar6 = *(int *)((long)info + 0x504);
      uVar10 = iVar6 + 1;
      *(uint *)((long)info + 0x504) = uVar10;
      if (8 < uVar10) {
        *(int *)((long)info + 0x504) = iVar6 + -8;
        cVar18 = *(char *)((long)info + 0x508);
        bVar2 = cVar18 + 1;
        *(byte *)((long)info + 0x508) = bVar2;
        if (2 < bVar2) {
          *(char *)((long)info + 0x508) = cVar18 + -2;
        }
      }
      iVar6 = *(int *)((long)info + 0x504);
      uVar10 = *(int *)((long)info + 0x500) + 1;
      *(uint *)((long)info + 0x500) = uVar10;
      lVar15 = 0;
      lVar17 = 0;
      do {
        if (iVar6 == 0) {
          bVar2 = *(byte *)((long)info + lVar15 + 0x41);
          bVar3 = *(byte *)((long)info + lVar15 + 0x42);
          if (*(char *)((long)info + 0x508) == '\0') {
            cVar18 = '\x01';
            if (bVar3 < bVar2) goto LAB_0015864d;
          }
          else {
            cVar18 = -1;
            if (bVar2 < bVar3) {
LAB_0015864d:
              *(byte *)((long)info + lVar15 + 0x42) = bVar3 + cVar18;
            }
          }
        }
        if (*(char *)((long)info + lVar15 + 0x50) != '\0') {
          *(UINT32 *)((long)info + lVar15 + 0x34) =
               *(int *)((long)info + lVar15 + 0x34) +
               lfo_period[*(byte *)((long)info + lVar15 + 0x46)] & 0x3ffff;
        }
        bVar2 = *(byte *)((long)info + lVar15 + 0x4f);
        uVar14 = bVar2 - 1;
        if (3 < uVar14) goto LAB_00158855;
        switch(uVar14) {
        case 0:
          if (*(char *)((long)info + lVar15 + 0x45) != '\0') break;
          uVar11 = (uint)*(byte *)((long)info + lVar15 + 0x4d);
LAB_00158712:
          if ((*(char *)((long)info + lVar15 + 0x3f) == '\0') ||
             (uVar12 = 0x14, *(short *)((long)info + lVar15 + 0x32) < 0xc0)) {
            if (uVar11 == 0) {
              uVar12 = 0;
              goto LAB_00158740;
            }
            if (uVar11 != 0xf) {
              uVar11 = uVar11 << 2;
              uVar19 = (uint)*(byte *)((long)info + lVar15 + 0x4c);
              if (uVar19 != 0xf) {
                iVar21 = (int)*(char *)((long)info + lVar15 + 0x3e) + uVar19;
                iVar16 = 0xf;
                if (iVar21 < 0xf) {
                  iVar16 = iVar21;
                }
                iVar16 = iVar16 * 2;
                if (iVar21 < 0) {
                  iVar16 = 0;
                }
                uVar11 = (uVar11 | *(uint *)((long)info + lVar15 + 0x3c) >> 9 & 1) + iVar16;
              }
              if (0x3e < (int)uVar11) {
                uVar11 = 0x3f;
              }
              uVar12 = (ulong)(uVar11 & 0xff);
              goto LAB_00158740;
            }
            goto LAB_0015873a;
          }
          goto LAB_00158740;
        case 1:
          if (*(char *)((long)info + lVar15 + 0x45) == '\0') {
            uVar11 = (uint)*(byte *)((long)info + lVar15 + 0x4b);
            goto LAB_00158712;
          }
          break;
        case 2:
          if (*(char *)((long)info + lVar15 + 0x45) == '\0') {
            uVar11 = (uint)*(byte *)((long)info + lVar15 + 0x4a);
            goto LAB_00158712;
          }
          break;
        case 3:
          bVar3 = *(byte *)((long)info + lVar15 + 0x49);
          uVar12 = (ulong)bVar3;
          if (bVar3 != 0) {
            if (bVar3 == 0xf) {
              uVar12 = 0x3f;
            }
            else {
              uVar12 = (ulong)bVar3 << 2;
              uVar11 = (uint)*(byte *)((long)info + lVar15 + 0x4c);
              if (uVar11 != 0xf) {
                iVar21 = (int)*(char *)((long)info + lVar15 + 0x3e) + uVar11;
                iVar16 = 0xf;
                if (iVar21 < 0xf) {
                  iVar16 = iVar21;
                }
                iVar16 = iVar16 * 2;
                if (iVar21 < 0) {
                  iVar16 = 0;
                }
                uVar12 = (ulong)(((uint)uVar12 | *(uint *)((long)info + lVar15 + 0x3c) >> 9 & 1) +
                                iVar16);
              }
              if (0x3e < (int)uVar12) {
                uVar12 = 0x3f;
              }
            }
          }
          if ((byte)uVar12 < 0x3f) {
            if ((uVar10 & ~(-1 << ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                                   [uVar12 & 0xff] & 0x1f))) != 0) goto LAB_00158855;
            sVar13 = *(short *)((long)info + lVar15 + 0x32);
            sVar13 = (short)((uint)""[(ulong)(uVar10 >> (
                                                  "\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                                                  [uVar12 & 0xff] & 0x1f) & 7) +
                                      (ulong)"pppp"[uVar12 & 0xff]] * ~(int)sVar13 >> 4) + sVar13;
            *(short *)((long)info + lVar15 + 0x32) = sVar13;
            if (1 < uVar14) {
              if (bVar2 != 3) {
                if ((bVar2 != 4) || (0 < sVar13)) goto LAB_00158855;
                *(undefined2 *)((long)info + lVar15 + 0x32) = 0;
                *(undefined1 *)((long)info + lVar15 + 0x4f) = 3;
              }
              if (*(short *)((long)info + lVar15 + 0x32) < *(short *)((long)info + lVar15 + 0x38))
              goto LAB_00158855;
              *(undefined1 *)((long)info + lVar15 + 0x4f) = 2;
            }
            psVar20 = (short *)((long)info + lVar15 + 0x32);
            if (*psVar20 < 0x280) goto LAB_00158855;
            goto LAB_001587d5;
          }
          goto LAB_00158855;
        }
        uVar12 = 0x30;
        if (0x7f < *(short *)((long)info + lVar15 + 0x32)) {
LAB_0015873a:
          uVar12 = 0x3f;
        }
LAB_00158740:
        if ((uVar10 & ~(-1 << ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                               [uVar12] & 0x1f))) == 0) {
          sVar13 = (ushort)""[(ulong)(uVar10 >> ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                                                 [uVar12] & 0x1f) & 7) + (ulong)"pppp"[uVar12]] +
                   *(short *)((long)info + lVar15 + 0x32);
          *(short *)((long)info + lVar15 + 0x32) = sVar13;
          if (1 < uVar14) {
            if (bVar2 != 3) {
              if ((bVar2 != 4) || (0 < sVar13)) goto LAB_00158855;
              *(undefined2 *)((long)info + lVar15 + 0x32) = 0;
              *(undefined1 *)((long)info + lVar15 + 0x4f) = 3;
            }
            if (*(short *)((long)info + lVar15 + 0x32) < *(short *)((long)info + lVar15 + 0x38))
            goto LAB_00158855;
            *(undefined1 *)((long)info + lVar15 + 0x4f) = 2;
          }
          if (0x27f < *(short *)((long)info + lVar15 + 0x32)) {
            psVar20 = (short *)((long)info + lVar17 * 0x34 + 0x32);
LAB_001587d5:
            *psVar20 = 0x280;
            *(undefined1 *)((long)info + lVar15 + 0x4f) = 0;
          }
        }
LAB_00158855:
        lVar17 = lVar17 + 1;
        lVar15 = lVar15 + 0x34;
      } while (lVar15 != 0x4e0);
      local_60 = local_60 + 1;
    } while (local_60 != samples);
  }
  return;
}

Assistant:

static void ymf278b_pcm_update(void *info, UINT32 samples, DEV_SMPL** outputs)
{
	YMF278BChip* chip = (YMF278BChip *)info;
	int i;
	UINT32 j;
	INT32 vl;
	INT32 vr;
	
	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	
	if (! ymf278b_anyActive(chip))
	{
		// TODO update internal state, even if muted
		// TODO also mute individual channels
		return;
	}

	vl = mix_level[chip->pcm_l];
	vr = mix_level[chip->pcm_r];
	for (j = 0; j < samples; j ++)
	{
		for (i = 0; i < 24; i ++)
		{
			YMF278BSlot* sl;
			INT16 sample;
			INT32 smplOut;
			UINT16 envVol;
			INT32 volLeft;
			INT32 volRight;
			UINT32 step;
			
			sl = &chip->slots[i];
			if (sl->state == EG_OFF || sl->Muted)
			{
				//outputs[0][j] += 0;
				//outputs[1][j] += 0;
				continue;
			}

			sample = (ymf278b_getSample(chip, sl, sl->pos) * (0x10000 - sl->stepptr) +
			          ymf278b_getSample(chip, sl, ymf278b_nextPos(sl, sl->pos, 1)) * sl->stepptr) >> 16;
			
			// TL levels are 00..FF internally (TL register value 7F is mapped to TL level FF)
			// Envelope levels have 4x the resolution (000..3FF)
			// Volume levels are approximate logarithmic: -6 db result in half volume. Steps in between use linear interpolation.
			// A volume of -60 db or lower results in silence. (value 0x280..0x3FF).
			// Recordings from actual hardware indicate, that TL level and envelope level are applied separately.
			// Each of them is clipped to silence below -60 db, but TL+envelope might result in a lower volume. -Valley Bell
			envVol = (UINT16)sl->env_vol;
			if (sl->lfo_active && sl->AM)
				envVol += ymf278b_slot_compute_am(sl);
			if (envVol >= MAX_ATT_INDEX)
				envVol = MAX_ATT_INDEX;
			smplOut = (sample * vol_tab[envVol]) >> 15;
			smplOut = (smplOut * vol_tab[sl->TL << TL_SHIFT]) >> 15;

			// Panning is also done separately. (low-volume TL + low-volume panning goes below -60 db)
			// I'll be taking wild guess and assume that -3 db is approximated with 75%. (same as with TL and envelope levels)
			// The same applies to the PCM mix level.
			volLeft  = pan_left [sl->pan] + vl;
			volRight = pan_right[sl->pan] + vr;
			// 0 -> 0x20, 8 -> 0x18, 16 -> 0x10, 24 -> 0x0C, etc. (not using vol_tab here saves array boundary checks)
			volLeft  = (0x20 - (volLeft  & 0x0F)) >> (volLeft  >> 4);
			volRight = (0x20 - (volRight & 0x0F)) >> (volRight >> 4);
			
			smplOut = (smplOut * 0x5A82) >> 17;	// reduce volume by -15 db, should bring it into balance with FM
			outputs[0][j] += (smplOut * volLeft ) >> 5;
			outputs[1][j] += (smplOut * volRight) >> 5;

			step = (sl->lfo_active && sl->vib)
			     ? calcStep(sl->OCT, sl->FN, ymf278b_slot_compute_vib(sl))
			     : sl->step;
			sl->stepptr += step;

			if (sl->stepptr >= 0x10000)
			{
				sl->pos = ymf278b_nextPos(sl, sl->pos, sl->stepptr >> 16);
				sl->stepptr &= 0xFFFF;
			}
		}
		ymf278b_advance(chip);
	}
}